

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Padding_x86::forward_int8(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  _func_int *p_Var5;
  void *pvVar6;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  Mat *pMVar17;
  long lVar18;
  Mat *pMVar19;
  int iVar20;
  undefined8 *puVar21;
  long lVar22;
  int iVar23;
  uint uVar24;
  undefined8 *puVar25;
  ulong uVar26;
  long lVar27;
  undefined8 *puVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  _func_int **local_108;
  Mat m;
  Option opt_pack1;
  
  m.w = bottom_blob->w;
  m.h = bottom_blob->h;
  iVar10 = bottom_blob->d;
  uVar9 = bottom_blob->c;
  m.d = bottom_blob->d;
  m.c = bottom_blob->c;
  m.elemsize = bottom_blob->elemsize;
  m.elempack = bottom_blob->elempack;
  m.dims = bottom_blob->dims;
  if (m.elempack == 8) {
    switch(m.dims) {
    case 1:
      p_Var5 = this->_vptr_Padding_x86[-3];
      uVar9 = *(uint *)(&this->field_0xd8 + (long)p_Var5) + m.w * 8 +
              *(int *)(&this->field_0xdc + (long)p_Var5);
      bVar33 = (uVar9 & 7) == 0;
      if ((bVar33 && (*(uint *)(&this->field_0xd8 + (long)p_Var5) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var5) == 0)) {
        Mat::create(top_blob,(int)uVar9 >> 3,(m.elemsize >> 3) << bVar33 * '\x03',8,
                    opt->blob_allocator);
        if ((Mat *)top_blob->data == (Mat *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          p_Var5 = this->_vptr_Padding_x86[-3];
          uVar26 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var5);
          iVar10 = *(int *)(&this->field_0xd8 + (long)p_Var5);
          iVar20 = iVar10 + 7;
          if (-1 < iVar10) {
            iVar20 = iVar10;
          }
          iVar10 = *(int *)(&this->field_0xdc + (long)p_Var5);
          iVar16 = iVar10 + 7;
          if (-1 < iVar10) {
            iVar16 = iVar10;
          }
          padding_constant_pack8_int8_sse
                    ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0,
                     iVar20 >> 3,iVar16 >> 3,
                     uVar26 << 0x38 | uVar26 << 0x30 | uVar26 << 0x28 |
                     uVar26 << 0x20 | uVar26 << 0x18 | uVar26 << 0x10 | uVar26 << 8 | uVar26);
          return 0;
        }
        return -100;
      }
      break;
    case 2:
      p_Var5 = this->_vptr_Padding_x86[-3];
      uVar9 = *(uint *)(&this->field_0xd0 + (long)p_Var5) + m.h * 8 +
              *(int *)(&this->field_0xd4 + (long)p_Var5);
      bVar33 = (uVar9 & 7) == 0;
      if ((bVar33 && (*(uint *)(&this->field_0xd0 + (long)p_Var5) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var5) == 0)) {
        Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var5) +
                             *(int *)(&this->field_0xdc + (long)p_Var5),(int)uVar9 >> 3,
                    (m.elemsize >> 3) << bVar33 * '\x03',8,opt->blob_allocator);
        if ((Mat *)top_blob->data == (Mat *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          p_Var5 = this->_vptr_Padding_x86[-3];
          uVar26 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var5);
          iVar10 = *(int *)(&this->field_0xd0 + (long)p_Var5);
          iVar20 = *(int *)(&this->field_0xd4 + (long)p_Var5);
          iVar16 = iVar10 + 7;
          if (-1 < iVar10) {
            iVar16 = iVar10;
          }
          iVar10 = iVar20 + 7;
          if (-1 < iVar20) {
            iVar10 = iVar20;
          }
          padding_constant_pack8_int8_sse
                    ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                     iVar16 >> 3,iVar10 >> 3,*(int *)(&this->field_0xd8 + (long)p_Var5),
                     *(int *)(&this->field_0xdc + (long)p_Var5),
                     uVar26 << 0x38 | uVar26 << 0x30 | uVar26 << 0x28 |
                     uVar26 << 0x20 | uVar26 << 0x18 | uVar26 << 0x10 | uVar26 << 8 | uVar26);
          return 0;
        }
        return -100;
      }
      break;
    case 3:
      p_Var5 = this->_vptr_Padding_x86[-3];
      uVar13 = *(uint *)(&this->field_0xe8 + (long)p_Var5) + uVar9 * 8 +
               *(int *)(&this->field_0xec + (long)p_Var5);
      bVar33 = (uVar13 & 7) == 0;
      if (bVar33 && (*(uint *)(&this->field_0xe8 + (long)p_Var5) & 7) == 0) {
        if ((uVar13 == uVar9 * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var5) == 0)) {
          uVar13 = (int)uVar13 >> 3;
          Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var5) + m.w +
                               *(int *)(&this->field_0xdc + (long)p_Var5),
                      *(int *)(&this->field_0xd0 + (long)p_Var5) + m.h +
                      *(int *)(&this->field_0xd4 + (long)p_Var5),uVar13,
                      (m.elemsize >> 3) << bVar33 * '\x03',8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            local_108 = this->_vptr_Padding_x86;
            iVar10 = *(int *)(&this->field_0xe8 + (long)local_108[-3]);
            iVar20 = iVar10 + 7;
            if (-1 < iVar10) {
              iVar20 = iVar10;
            }
            if ((int)uVar13 < 1) {
              return 0;
            }
            uVar26 = 0;
            auVar38 = _DAT_005166f0;
            uVar24 = -(iVar20 >> 3);
            do {
              pvVar6 = top_blob->data;
              uVar11 = top_blob->elemsize;
              p_Var5 = local_108[-3];
              uVar32 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var5);
              uVar32 = uVar32 << 0x38 | uVar32 << 0x30 | uVar32 << 0x28 |
                       uVar32 << 0x20 | uVar32 << 0x18 | uVar32 << 0x10 | uVar32 << 8 | uVar32;
              uVar8 = -(iVar20 >> 3) + (int)uVar26;
              if ((int)uVar8 < 0 || (int)uVar9 <= (int)uVar8) {
                lVar18 = (long)top_blob->h * (long)top_blob->w;
                iVar10 = (int)((lVar18 * uVar11 + 0xf & 0xfffffffffffffff0) / uVar11);
                if (top_blob->dims == 4) {
                  iVar10 = (int)lVar18;
                }
                uVar8 = iVar10 * top_blob->d;
                if (0 < (int)uVar8) {
                  lVar18 = (ulong)uVar8 - 1;
                  auVar34._8_4_ = (int)lVar18;
                  auVar34._0_8_ = lVar18;
                  auVar34._12_4_ = (int)((ulong)lVar18 >> 0x20);
                  lVar18 = top_blob->cstep * uVar11 * uVar26;
                  auVar34 = auVar34 ^ auVar38;
                  uVar11 = 0;
                  auVar37 = _DAT_00516800;
                  do {
                    auVar36 = auVar37 ^ auVar38;
                    if ((bool)(~(auVar34._4_4_ < auVar36._4_4_ ||
                                auVar34._0_4_ < auVar36._0_4_ && auVar36._4_4_ == auVar34._4_4_) & 1
                              )) {
                      *(ulong *)((long)pvVar6 + uVar11 * 8 + lVar18) = uVar32;
                    }
                    if (auVar36._12_4_ <= auVar34._12_4_ &&
                        (auVar36._8_4_ <= auVar34._8_4_ || auVar36._12_4_ != auVar34._12_4_)) {
                      *(ulong *)((long)pvVar6 + uVar11 * 8 + lVar18 + 8) = uVar32;
                    }
                    uVar11 = uVar11 + 2;
                    lVar22 = auVar37._8_8_;
                    auVar37._0_8_ = auVar37._0_8_ + 2;
                    auVar37._8_8_ = lVar22 + 2;
                  } while ((uVar8 + 1 & 0xfffffffe) != uVar11);
                }
              }
              else {
                iVar10 = bottom_blob->w;
                lVar18 = (long)iVar10;
                iVar16 = bottom_blob->h;
                pvVar4 = bottom_blob->data;
                uVar14 = bottom_blob->elemsize;
                sVar7 = bottom_blob->cstep;
                puVar28 = (undefined8 *)(uVar8 * sVar7 * uVar14 + (long)pvVar4);
                m.elempack = bottom_blob->elempack;
                m.allocator = bottom_blob->allocator;
                m.refcount = (int *)0x0;
                m.c = bottom_blob->d;
                m.d = 1;
                m.dims = bottom_blob->dims + -1;
                m.cstep = (uVar14 * iVar16 * lVar18 + 0xf & 0xfffffffffffffff0) / uVar14;
                if (bottom_blob->dims == 4) {
                  m.cstep = iVar16 * lVar18;
                }
                pMVar17 = (Mat *)((long)pvVar6 + top_blob->cstep * uVar26 * uVar11);
                if (*(int *)(&this->field_0xe0 + (long)p_Var5) == 0) {
                  m.data = puVar28;
                  m.elemsize = uVar14;
                  m.w = iVar10;
                  m.h = iVar16;
                  padding_constant_pack8_int8_sse
                            ((ncnn *)&m,pMVar17,(Mat *)(long)top_blob->w,
                             *(int *)(&this->field_0xd0 + (long)p_Var5),
                             *(int *)(&this->field_0xd4 + (long)p_Var5),
                             *(int *)(&this->field_0xd8 + (long)p_Var5),
                             *(int *)(&this->field_0xdc + (long)p_Var5),uVar32);
                  local_108 = this->_vptr_Padding_x86;
                  auVar38 = _DAT_005166f0;
                }
                p_Var5 = local_108[-3];
                if (*(int *)(&this->field_0xe0 + (long)p_Var5) == 1) {
                  iVar12 = *(int *)(&this->field_0xd0 + (long)p_Var5);
                  iVar1 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                  iVar15 = *(int *)(&this->field_0xd8 + (long)p_Var5);
                  iVar2 = *(int *)(&this->field_0xdc + (long)p_Var5);
                  pMVar19 = pMVar17;
                  if (0 < iVar12) {
                    lVar22 = sVar7 * uVar14 * (ulong)uVar24;
                    iVar23 = 0;
                    do {
                      if (0 < iVar15) {
                        pvVar6 = (void *)*puVar28;
                        iVar29 = iVar15;
                        do {
                          pMVar19->data = pvVar6;
                          pMVar19 = (Mat *)&pMVar19->refcount;
                          iVar29 = iVar29 + -1;
                        } while (iVar29 != 0);
                      }
                      puVar21 = puVar28;
                      if (0 < iVar10) {
                        lVar27 = 0;
                        lVar30 = 0;
                        do {
                          (&pMVar19->data)[lVar30] = *(void **)((long)pvVar4 + lVar30 * 8 + lVar22);
                          lVar30 = lVar30 + 1;
                          lVar27 = lVar27 + -8;
                        } while (iVar10 != (int)lVar30);
                        pMVar19 = (Mat *)((long)pMVar19 - lVar27);
                        puVar21 = (undefined8 *)((long)pvVar4 + (lVar22 - lVar27));
                      }
                      if (0 < iVar2) {
                        pvVar6 = (void *)puVar21[-1];
                        iVar29 = iVar2;
                        do {
                          pMVar19->data = pvVar6;
                          pMVar19 = (Mat *)&pMVar19->refcount;
                          iVar29 = iVar29 + -1;
                        } while (iVar29 != 0);
                      }
                      iVar23 = iVar23 + 1;
                    } while (iVar23 != iVar12);
                  }
                  puVar21 = puVar28;
                  if (0 < iVar16) {
                    iVar12 = 0;
                    do {
                      if (0 < iVar15) {
                        pvVar6 = (void *)*puVar21;
                        iVar23 = iVar15;
                        do {
                          pMVar19->data = pvVar6;
                          pMVar19 = (Mat *)&pMVar19->refcount;
                          iVar23 = iVar23 + -1;
                        } while (iVar23 != 0);
                      }
                      if (0 < iVar10) {
                        lVar22 = 0;
                        lVar27 = 0;
                        do {
                          (&pMVar19->data)[lVar27] = (void *)puVar21[lVar27];
                          lVar27 = lVar27 + 1;
                          lVar22 = lVar22 + -8;
                        } while (iVar10 != (int)lVar27);
                        pMVar19 = (Mat *)((long)pMVar19 - lVar22);
                        puVar21 = (undefined8 *)((long)puVar21 - lVar22);
                      }
                      if (0 < iVar2) {
                        pvVar6 = (void *)puVar21[-1];
                        iVar23 = iVar2;
                        do {
                          pMVar19->data = pvVar6;
                          pMVar19 = (Mat *)&pMVar19->refcount;
                          iVar23 = iVar23 + -1;
                        } while (iVar23 != 0);
                      }
                      iVar12 = iVar12 + 1;
                    } while (iVar12 != iVar16);
                  }
                  if (0 < iVar1) {
                    puVar21 = puVar21 + -lVar18;
                    iVar12 = 0;
                    do {
                      if (0 < iVar15) {
                        pvVar6 = (void *)*puVar21;
                        iVar23 = iVar15;
                        do {
                          pMVar19->data = pvVar6;
                          pMVar19 = (Mat *)&pMVar19->refcount;
                          iVar23 = iVar23 + -1;
                        } while (iVar23 != 0);
                      }
                      puVar25 = puVar21;
                      if (0 < iVar10) {
                        lVar22 = 0;
                        lVar27 = 0;
                        do {
                          (&pMVar19->data)[lVar27] = (void *)puVar21[lVar27];
                          lVar27 = lVar27 + 1;
                          lVar22 = lVar22 + -8;
                        } while (iVar10 != (int)lVar27);
                        pMVar19 = (Mat *)((long)pMVar19 - lVar22);
                        puVar25 = (undefined8 *)((long)puVar21 - lVar22);
                      }
                      if (0 < iVar2) {
                        pvVar6 = (void *)puVar25[-1];
                        iVar23 = iVar2;
                        do {
                          pMVar19->data = pvVar6;
                          pMVar19 = (Mat *)&pMVar19->refcount;
                          iVar23 = iVar23 + -1;
                        } while (iVar23 != 0);
                      }
                      iVar12 = iVar12 + 1;
                    } while (iVar12 != iVar1);
                  }
                }
                p_Var5 = local_108[-3];
                if (*(int *)(&this->field_0xe0 + (long)p_Var5) == 2) {
                  iVar12 = *(int *)(&this->field_0xd0 + (long)p_Var5);
                  iVar1 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                  uVar8 = *(uint *)(&this->field_0xd8 + (long)p_Var5);
                  lVar27 = (long)(int)uVar8;
                  uVar32 = (ulong)uVar8;
                  uVar3 = *(uint *)(&this->field_0xdc + (long)p_Var5);
                  uVar11 = (ulong)uVar3;
                  lVar22 = (long)(iVar12 * iVar10);
                  if (iVar12 < 1) {
                    puVar28 = puVar28 + lVar22;
                  }
                  else {
                    lVar30 = sVar7 * uVar14 * (ulong)uVar24;
                    lVar31 = lVar30 + lVar27 * 8 + lVar22 * 8 + (long)pvVar4;
                    puVar28 = (undefined8 *)(lVar30 + lVar22 * 8 + (long)pvVar4);
                    iVar15 = 0;
                    do {
                      if (0 < (int)uVar8) {
                        lVar22 = 0;
                        do {
                          pMVar17->data = *(void **)(lVar31 + lVar22 * 8);
                          pMVar17 = (Mat *)&pMVar17->refcount;
                          lVar22 = lVar22 + -1;
                        } while (-lVar22 != uVar32);
                      }
                      puVar21 = puVar28;
                      if (0 < iVar10) {
                        lVar30 = 0;
                        lVar22 = 0;
                        do {
                          (&pMVar17->data)[lVar22] = (void *)puVar28[lVar22];
                          lVar22 = lVar22 + 1;
                          lVar30 = lVar30 + -8;
                        } while (iVar10 != (int)lVar22);
                        pMVar17 = (Mat *)((long)pMVar17 - lVar30);
                        puVar21 = (undefined8 *)((long)puVar28 - lVar30);
                      }
                      if (0 < (int)uVar3) {
                        lVar22 = 0;
                        do {
                          pMVar17->data = (void *)puVar21[lVar22 + -2];
                          pMVar17 = (Mat *)&pMVar17->refcount;
                          lVar22 = lVar22 + -1;
                        } while (-lVar22 != uVar11);
                      }
                      puVar28 = puVar28 + -lVar18;
                      iVar15 = iVar15 + 1;
                      lVar31 = lVar31 + lVar18 * -8;
                    } while (iVar15 != iVar12);
                  }
                  if (0 < iVar16) {
                    iVar12 = 0;
                    do {
                      if (0 < (int)uVar8) {
                        lVar22 = 0;
                        do {
                          pMVar17->data = (void *)puVar28[lVar27 + lVar22];
                          pMVar17 = (Mat *)&pMVar17->refcount;
                          lVar22 = lVar22 + -1;
                        } while (-lVar22 != uVar32);
                      }
                      if (0 < iVar10) {
                        lVar30 = 0;
                        lVar22 = 0;
                        do {
                          (&pMVar17->data)[lVar22] = (void *)puVar28[lVar22];
                          lVar22 = lVar22 + 1;
                          lVar30 = lVar30 + -8;
                        } while (iVar10 != (int)lVar22);
                        pMVar17 = (Mat *)((long)pMVar17 - lVar30);
                        puVar28 = (undefined8 *)((long)puVar28 - lVar30);
                      }
                      if (0 < (int)uVar3) {
                        lVar22 = 0;
                        do {
                          pMVar17->data = (void *)puVar28[lVar22 + -2];
                          pMVar17 = (Mat *)&pMVar17->refcount;
                          lVar22 = lVar22 + -1;
                        } while (-lVar22 != uVar11);
                      }
                      iVar12 = iVar12 + 1;
                    } while (iVar12 != iVar16);
                  }
                  if (0 < iVar1) {
                    puVar21 = puVar28 + -(long)(iVar10 * 2);
                    puVar28 = puVar28 + (lVar27 - iVar10 * 2);
                    iVar16 = 0;
                    do {
                      if (0 < (int)uVar8) {
                        lVar22 = 0;
                        do {
                          pMVar17->data = (void *)puVar28[lVar22];
                          pMVar17 = (Mat *)&pMVar17->refcount;
                          lVar22 = lVar22 + -1;
                        } while (-lVar22 != uVar32);
                      }
                      puVar25 = puVar21;
                      if (0 < iVar10) {
                        lVar27 = 0;
                        lVar22 = 0;
                        do {
                          (&pMVar17->data)[lVar22] = (void *)puVar21[lVar22];
                          lVar22 = lVar22 + 1;
                          lVar27 = lVar27 + -8;
                        } while (iVar10 != (int)lVar22);
                        pMVar17 = (Mat *)((long)pMVar17 - lVar27);
                        puVar25 = (undefined8 *)((long)puVar21 - lVar27);
                      }
                      if (0 < (int)uVar3) {
                        lVar22 = 0;
                        do {
                          pMVar17->data = (void *)puVar25[lVar22 + -2];
                          pMVar17 = (Mat *)&pMVar17->refcount;
                          lVar22 = lVar22 + -1;
                        } while (-lVar22 != uVar11);
                      }
                      puVar21 = puVar21 + -lVar18;
                      iVar16 = iVar16 + 1;
                      puVar28 = puVar28 + -lVar18;
                    } while (iVar16 != iVar1);
                  }
                }
              }
              uVar26 = uVar26 + 1;
              uVar24 = uVar24 + 1;
            } while (uVar26 != uVar13);
            return 0;
          }
          return -100;
        }
      }
      break;
    case 4:
      p_Var5 = this->_vptr_Padding_x86[-3];
      if (*(int *)(&this->field_0xe0 + (long)p_Var5) == 0) {
        uVar13 = *(int *)(&this->field_0xe8 + (long)p_Var5) + iVar10 +
                 *(int *)(&this->field_0xec + (long)p_Var5);
        Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var5) +
                             *(int *)(&this->field_0xdc + (long)p_Var5),
                    m.h + *(int *)(&this->field_0xd0 + (long)p_Var5) +
                    *(int *)(&this->field_0xd4 + (long)p_Var5),uVar13,uVar9,m.elemsize,8,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          if ((int)uVar9 < 1) {
            return 0;
          }
          uVar26 = 0;
          auVar38 = _DAT_005166f0;
          do {
            if (0 < (int)uVar13) {
              uVar11 = (ulong)*(float *)(&this->field_0xe4 + (long)this->_vptr_Padding_x86[-3]);
              uVar11 = uVar11 << 0x38 | uVar11 << 0x30 | uVar11 << 0x28 |
                       uVar11 << 0x20 | uVar11 << 0x18 | uVar11 << 0x10 | uVar11 << 8 | uVar11;
              uVar32 = 0;
              do {
                pMVar17 = (Mat *)(long)top_blob->w;
                pvVar6 = top_blob->data;
                sVar7 = top_blob->elemsize;
                lVar22 = top_blob->cstep * uVar26;
                lVar18 = (long)top_blob->h * (long)pMVar17;
                p_Var5 = this->_vptr_Padding_x86[-3];
                uVar24 = (int)uVar32 - *(int *)(&this->field_0xe8 + (long)p_Var5);
                if ((int)uVar24 < 0 || iVar10 <= (int)uVar24) {
                  uVar24 = (uint)lVar18;
                  if (0 < (int)uVar24) {
                    lVar18 = (ulong)(uVar24 & 0x7fffffff) - 1;
                    auVar35._8_4_ = (int)lVar18;
                    auVar35._0_8_ = lVar18;
                    auVar35._12_4_ = (int)((ulong)lVar18 >> 0x20);
                    lVar18 = sVar7 * ((long)top_blob->h * uVar32 * (long)pMVar17 + lVar22);
                    auVar35 = auVar35 ^ auVar38;
                    uVar14 = 0;
                    auVar36 = _DAT_00516800;
                    do {
                      auVar37 = auVar36 ^ auVar38;
                      if ((bool)(~(auVar35._4_4_ < auVar37._4_4_ ||
                                  auVar35._0_4_ < auVar37._0_4_ && auVar37._4_4_ == auVar35._4_4_) &
                                1)) {
                        *(ulong *)((long)pvVar6 + uVar14 * 8 + lVar18) = uVar11;
                      }
                      if (auVar37._12_4_ <= auVar35._12_4_ &&
                          (auVar37._8_4_ <= auVar35._8_4_ || auVar37._12_4_ != auVar35._12_4_)) {
                        *(ulong *)((long)pvVar6 + uVar14 * 8 + lVar18 + 8) = uVar11;
                      }
                      uVar14 = uVar14 + 2;
                      lVar22 = auVar36._8_8_;
                      auVar36._0_8_ = auVar36._0_8_ + 2;
                      auVar36._8_8_ = lVar22 + 2;
                    } while ((uVar24 + 1 & 0xfffffffe) != uVar14);
                  }
                }
                else {
                  m.w = bottom_blob->w;
                  m.elemsize = bottom_blob->elemsize;
                  m.h = bottom_blob->h;
                  m.cstep = (long)m.h * (long)m.w;
                  m.elempack = bottom_blob->elempack;
                  m.data = (void *)((long)bottom_blob->data +
                                   m.cstep * m.elemsize * (ulong)uVar24 +
                                   bottom_blob->cstep * uVar26 * m.elemsize);
                  m.allocator = bottom_blob->allocator;
                  m.refcount = (int *)0x0;
                  m.dims = 2;
                  m.d = 1;
                  m.c = 1;
                  padding_constant_pack8_int8_sse
                            ((ncnn *)&m,
                             (Mat *)((long)pvVar6 + lVar18 * sVar7 * uVar32 + lVar22 * sVar7),
                             pMVar17,*(int *)(&this->field_0xd0 + (long)p_Var5),
                             *(int *)(&this->field_0xd4 + (long)p_Var5),
                             *(int *)(&this->field_0xd8 + (long)p_Var5),
                             *(int *)(&this->field_0xdc + (long)p_Var5),uVar11);
                  auVar38 = _DAT_005166f0;
                }
                uVar32 = uVar32 + 1;
              } while (uVar32 != uVar13);
            }
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar9);
          return 0;
        }
        return -100;
      }
    }
  }
  m.data = bottom_blob->data;
  m.refcount = bottom_blob->refcount;
  m.allocator = bottom_blob->allocator;
  m.cstep = bottom_blob->cstep;
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + 1;
    UNLOCK();
  }
  if (m.elempack != 1) {
    opt_pack1.lightmode = opt->lightmode;
    opt_pack1._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_pack1.num_threads = opt->num_threads;
    opt_pack1.workspace_allocator = opt->workspace_allocator;
    opt_pack1.openmp_blocktime = opt->openmp_blocktime;
    opt_pack1.use_winograd_convolution = opt->use_winograd_convolution;
    opt_pack1.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_pack1.use_int8_inference = opt->use_int8_inference;
    opt_pack1.use_vulkan_compute = opt->use_vulkan_compute;
    opt_pack1.use_bf16_storage = opt->use_bf16_storage;
    opt_pack1.use_fp16_packed = opt->use_fp16_packed;
    opt_pack1.use_fp16_storage = opt->use_fp16_storage;
    opt_pack1.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_pack1.use_int8_packed = opt->use_int8_packed;
    opt_pack1.use_int8_storage = opt->use_int8_storage;
    opt_pack1.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_pack1.use_packing_layout = opt->use_packing_layout;
    opt_pack1.use_shader_pack8 = opt->use_shader_pack8;
    opt_pack1.use_subgroup_basic = opt->use_subgroup_basic;
    opt_pack1.use_subgroup_vote = opt->use_subgroup_vote;
    opt_pack1.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_pack1.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_pack1.use_image_storage = opt->use_image_storage;
    opt_pack1.use_tensor_storage = opt->use_tensor_storage;
    opt_pack1.use_reserved_0 = opt->use_reserved_0;
    opt_pack1.flush_denormals = opt->flush_denormals;
    opt_pack1.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_pack1.use_shader_local_memory = opt->use_shader_local_memory;
    opt_pack1.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_pack1.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_pack1.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_pack1.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_pack1.use_reserved_6 = opt->use_reserved_6;
    opt_pack1.use_reserved_7 = opt->use_reserved_7;
    opt_pack1.use_reserved_8 = opt->use_reserved_8;
    opt_pack1.use_reserved_9 = opt->use_reserved_9;
    opt_pack1.use_reserved_10 = opt->use_reserved_10;
    opt_pack1.use_reserved_11 = opt->use_reserved_11;
    opt_pack1.blob_allocator = opt->workspace_allocator;
    convert_packing(bottom_blob,&m,1,&opt_pack1);
  }
  iVar10 = Padding::forward((Padding *)
                            ((long)&this->_vptr_Padding_x86 + (long)this->_vptr_Padding_x86[-3]),&m,
                            top_blob,opt);
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + -1;
    UNLOCK();
    if (*m.refcount == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar10;
}

Assistant:

int Padding_x86::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}